

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O2

int Gia_Rsb2ManMffc(Gia_Rsb2Man_t *p,int iNode)

{
  int *pObjs;
  int *pRefs;
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  Vec_IntFill(&p->vRefs,p->nObjs,0);
  pObjs = (p->vObjs).pArray;
  if (pObjs[iNode * 2] == pObjs[iNode * 2 + 1]) {
    __assert_fail("pObjs[2*iNode+0] != pObjs[2*iNode+1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                  ,0xf0,"int Gia_Rsb2ManMffc(Gia_Rsb2Man_t *, int)");
  }
  pRefs = (p->vRefs).pArray;
  lVar4 = (long)p->nPis;
  while( true ) {
    lVar4 = lVar4 + 1;
    lVar3 = (long)p->iFirstPo;
    if (lVar3 <= lVar4) break;
    uVar1 = Abc_Lit2Var(pObjs[lVar4 * 2]);
    pRefs[uVar1] = pRefs[uVar1] + 1;
    uVar1 = Abc_Lit2Var(pObjs[lVar4 * 2 + 1]);
    pRefs[uVar1] = pRefs[uVar1] + 1;
  }
  for (; lVar3 < p->nObjs; lVar3 = lVar3 + 1) {
    uVar1 = Abc_Lit2Var(pObjs[lVar3 * 2]);
    pRefs[uVar1] = pRefs[uVar1] + 1;
  }
  lVar4 = (long)p->nPis;
  while (lVar4 = lVar4 + 1, lVar4 < p->iFirstPo) {
    if (pRefs[lVar4] == 0) {
      __assert_fail("pRefs[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                    ,0xf7,"int Gia_Rsb2ManMffc(Gia_Rsb2Man_t *, int)");
    }
  }
  lVar4 = (long)iNode;
  do {
    pRefs[lVar4] = 0;
    do {
      lVar4 = lVar4 + 1;
      if (p->iFirstPo <= lVar4) {
        iVar2 = Gia_Rsb2ManDeref_rec(p,pObjs,pRefs,iNode);
        return iVar2;
      }
      uVar1 = Abc_Lit2Var(pObjs[lVar4 * 2]);
    } while ((pRefs[uVar1] != 0) && (uVar1 = Abc_Lit2Var(pObjs[lVar4 * 2 + 1]), pRefs[uVar1] != 0));
  } while( true );
}

Assistant:

int Gia_Rsb2ManMffc( Gia_Rsb2Man_t * p, int iNode )
{
    int i, * pRefs, * pObjs;
    Vec_IntFill( &p->vRefs, p->nObjs, 0 );
    pRefs = Vec_IntArray( &p->vRefs );
    pObjs = Vec_IntArray( &p->vObjs );
    assert( pObjs[2*iNode+0] != pObjs[2*iNode+1] );
    for ( i = p->nPis + 1; i < p->iFirstPo; i++ )
        pRefs[Abc_Lit2Var(pObjs[2*i+0])]++, 
        pRefs[Abc_Lit2Var(pObjs[2*i+1])]++;
    for ( i = p->iFirstPo; i < p->nObjs; i++ )
        pRefs[Abc_Lit2Var(pObjs[2*i+0])]++;
    for ( i = p->nPis + 1; i < p->iFirstPo; i++ )
        assert( pRefs[i] );
    pRefs[iNode] = 0;
    for ( i = iNode + 1; i < p->iFirstPo; i++ )
        if ( !pRefs[Abc_Lit2Var(pObjs[2*i+0])] || !pRefs[Abc_Lit2Var(pObjs[2*i+1])] )
            pRefs[i] = 0;
    return Gia_Rsb2ManDeref_rec( p, pObjs, pRefs, iNode );
}